

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simplify.c
# Opt level: O2

int simplify_cond_branch(dmr_C *C,instruction *br,pseudo_t cond,instruction *def,pseudo_t *pp)

{
  anon_struct_16_3_b3cb483e_for_anon_union_24_12_0e8c74c2_for_instruction_7_20 aVar1;
  int extraout_EAX;
  anon_struct_16_2_cb6bab4e_for_anon_union_24_12_0e8c74c2_for_instruction_7_2 aVar2;
  
  dmrC_use_pseudo(C,br,*pp,&(br->field_5).target);
  remove_usage(C,cond,&(br->field_5).target);
  if (*(char *)def == '\x19') {
    aVar1 = (br->field_6).field_10;
    aVar2.bb_true = aVar1.context_expr;
    aVar2.bb_false._0_4_ = aVar1.increment;
    aVar2.bb_false._4_4_ = aVar1.check;
    (br->field_6).field_1 = aVar2;
  }
  return extraout_EAX;
}

Assistant:

static int simplify_cond_branch(struct dmr_C *C, struct instruction *br, pseudo_t cond, struct instruction *def, pseudo_t *pp)
{
	dmrC_use_pseudo(C, br, *pp, &br->cond);
	remove_usage(C, cond, &br->cond);
	if (def->opcode == OP_SET_EQ) {
		struct basic_block *true = br->bb_true;
		struct basic_block *false = br->bb_false;
		br->bb_false = true;
		br->bb_true = false;
	}
	return REPEAT_CSE;
}